

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O3

void hbtrie_init(hbtrie *trie,int chunksize,int valuelen,int btree_nodesize,bid_t root_bid,
                void *btreeblk_handle,btree_blk_ops *btree_blk_ops,void *doc_handle,
                hbtrie_func_readkey *readkey)

{
  btree_kv_ops *pbVar1;
  btree_kv_ops *pbVar2;
  void *__s;
  size_t val;
  
  trie->chunksize = (uint8_t)chunksize;
  trie->valuelen = (uint8_t)valuelen;
  trie->btree_nodesize = btree_nodesize;
  trie->btree_blk_ops = btree_blk_ops;
  trie->btreeblk_handle = btreeblk_handle;
  trie->doc_handle = doc_handle;
  trie->root_bid = root_bid;
  trie->flag = '\0';
  trie->leaf_height_limit = '\0';
  (trie->cmp_args).chunksize = (uint8_t)chunksize;
  (trie->cmp_args).cmp_func = (undefined1 *)0x0;
  (trie->cmp_args).user_param = (void *)0x0;
  trie->aux = &trie->cmp_args;
  pbVar1 = (btree_kv_ops *)malloc(0x78);
  pbVar2 = (btree_kv_ops *)malloc(0x78);
  if (valuelen != 8) {
    fdb_assert_die("valuelen == 8",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/hbtrie.cc"
                   ,0xa6,(long)valuelen,(uint64_t)trie);
  }
  val = (size_t)chunksize;
  if ((uint)chunksize < 8) {
    fdb_assert_die("(size_t)chunksize >= sizeof(void *)",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/hbtrie.cc"
                   ,0xa7,val,(uint64_t)trie);
    if (chunksize == 4 && (valuelen ^ 8U) == 0) {
      pbVar1 = btree_kv_get_kb32_vb64(pbVar1);
      goto LAB_00127c43;
    }
  }
  else if (chunksize == 8 && (valuelen ^ 8U) == 0) {
    pbVar1 = btree_kv_get_kb64_vb64(pbVar1);
    goto LAB_00127c43;
  }
  pbVar1 = btree_kv_get_kbn_vb64(pbVar1);
LAB_00127c43:
  pbVar2 = btree_fast_str_kv_get_kb64_vb64(pbVar2);
  trie->btree_kv_ops = pbVar1;
  trie->btree_leaf_kv_ops = pbVar2;
  trie->readkey = readkey;
  trie->map = (hbtrie_cmp_map *)0x0;
  __s = malloc(val);
  trie->last_map_chunk = __s;
  memset(__s,0xff,val);
  return;
}

Assistant:

void hbtrie_init(struct hbtrie *trie, int chunksize, int valuelen,
                 int btree_nodesize, bid_t root_bid, void *btreeblk_handle,
                 struct btree_blk_ops *btree_blk_ops, void *doc_handle,
                 hbtrie_func_readkey *readkey)
{
    struct btree_kv_ops *btree_kv_ops, *btree_leaf_kv_ops;

    trie->chunksize = chunksize;
    trie->valuelen = valuelen;
    trie->btree_nodesize = btree_nodesize;
    trie->btree_blk_ops = btree_blk_ops;
    trie->btreeblk_handle = btreeblk_handle;
    trie->doc_handle = doc_handle;
    trie->root_bid = root_bid;
    trie->flag = 0x0;
    trie->leaf_height_limit = 0;
    trie->cmp_args.chunksize = chunksize;
    trie->cmp_args.cmp_func = NULL;
    trie->cmp_args.user_param = NULL;
    trie->aux = &trie->cmp_args;

    // assign key-value operations
    btree_kv_ops = (struct btree_kv_ops *)malloc(sizeof(struct btree_kv_ops));
    btree_leaf_kv_ops = (struct btree_kv_ops *)malloc(sizeof(struct btree_kv_ops));

    fdb_assert(valuelen == 8, valuelen, trie);
    fdb_assert((size_t)chunksize >= sizeof(void *), chunksize, trie);

    if (chunksize == 8 && valuelen == 8){
        btree_kv_ops = btree_kv_get_kb64_vb64(btree_kv_ops);
        btree_leaf_kv_ops = _get_leaf_kv_ops(btree_leaf_kv_ops);
    } else if (chunksize == 4 && valuelen == 8) {
        btree_kv_ops = btree_kv_get_kb32_vb64(btree_kv_ops);
        btree_leaf_kv_ops = _get_leaf_kv_ops(btree_leaf_kv_ops);
    } else {
        btree_kv_ops = btree_kv_get_kbn_vb64(btree_kv_ops);
        btree_leaf_kv_ops = _get_leaf_kv_ops(btree_leaf_kv_ops);
    }

    trie->btree_kv_ops = btree_kv_ops;
    trie->btree_leaf_kv_ops = btree_leaf_kv_ops;
    trie->readkey = readkey;
    trie->map = NULL;
    trie->last_map_chunk = (void *)malloc(chunksize);
    memset(trie->last_map_chunk, 0xff, chunksize); // set 0xffff...
}